

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QTextEdit::ExtraSelection>::emplace<QTextEdit::ExtraSelection_const&>
          (QGenericArrayOps<QTextEdit::ExtraSelection> *this,qsizetype i,ExtraSelection *args)

{
  ExtraSelection **ppEVar1;
  qsizetype *pqVar2;
  QTextFormat *this_00;
  Data *pDVar3;
  long lVar4;
  ExtraSelection *pEVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_98;
  undefined1 local_48 [16];
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_004d641a:
    this_00 = (QTextFormat *)(local_48 + 8);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor((QTextCursor *)local_48,&args->cursor);
    QTextFormat::QTextFormat(this_00,&(args->format).super_QTextFormat);
    bVar6 = (this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).size != 0;
    QArrayDataPointer<QTextEdit::ExtraSelection>::detachAndGrow
              (&this->super_QArrayDataPointer<QTextEdit::ExtraSelection>,(uint)(i == 0 && bVar6),1,
               (ExtraSelection **)0x0,(QArrayDataPointer<QTextEdit::ExtraSelection> *)0x0);
    if (i == 0 && bVar6) {
      pEVar5 = (this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).ptr;
      QTextCursor::QTextCursor(&pEVar5[-1].cursor,(QTextCursor *)local_48);
      QTextFormat::QTextFormat(&pEVar5[-1].format.super_QTextFormat,this_00);
      ppEVar1 = &(this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).ptr;
      *ppEVar1 = *ppEVar1 + -1;
      pqVar2 = &(this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_98.sourceCopyConstruct = 0;
      local_98.nSource = 0;
      local_98.move = 0;
      local_98.sourceCopyAssign = 0;
      local_98.end = (ExtraSelection *)0x0;
      local_98.last = (ExtraSelection *)0x0;
      local_98.where = (ExtraSelection *)0x0;
      local_98.begin = (this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).ptr;
      local_98.size = (this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).size;
      local_98.data = &this->super_QArrayDataPointer<QTextEdit::ExtraSelection>;
      Inserter::insertOne(&local_98,i,(ExtraSelection *)local_48);
      (local_98.data)->ptr = local_98.begin;
      (local_98.data)->size = local_98.size;
    }
    QTextFormat::~QTextFormat(this_00);
    QTextCursor::~QTextCursor((QTextCursor *)local_48);
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x5555555555555555)) {
      pEVar5 = (this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).ptr;
      QTextCursor::QTextCursor(&pEVar5[lVar4].cursor,&args->cursor);
      QTextFormat::QTextFormat
                (&pEVar5[lVar4].format.super_QTextFormat,&(args->format).super_QTextFormat);
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((ExtraSelection *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).ptr)) goto LAB_004d641a;
      pEVar5 = (this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).ptr;
      QTextCursor::QTextCursor(&pEVar5[-1].cursor,&args->cursor);
      QTextFormat::QTextFormat
                (&pEVar5[-1].format.super_QTextFormat,&(args->format).super_QTextFormat);
      ppEVar1 = &(this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).ptr;
      *ppEVar1 = *ppEVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }